

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# winmakefile.cpp
# Opt level: O2

void __thiscall Win32MakefileGenerator::writeRcFilePart(Win32MakefileGenerator *this,QTextStream *t)

{
  long lVar1;
  QMakeProject *pQVar2;
  ulong uVar3;
  QString *pQVar4;
  bool bVar5;
  ProStringList *pPVar6;
  QTextStream *pQVar7;
  char *pcVar8;
  ulong uVar9;
  long lVar10;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_208;
  ProString local_1f0;
  QArrayDataPointer<char16_t> local_1c0;
  ProKey local_1a8;
  QArrayDataPointer<char16_t> local_178;
  QArrayDataPointer<QString> local_160;
  QArrayDataPointer<char16_t> local_148;
  QArrayDataPointer<QString> local_130;
  QArrayDataPointer<char16_t> local_118;
  QArrayDataPointer<ProString> local_100;
  ProString local_e8;
  QArrayDataPointer<char16_t> local_b8;
  ProString defines;
  ProString res_file;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (this->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)&res_file,"RC_FILE");
  pPVar6 = QMakeEvaluator::valuesRef(&pQVar2->super_QMakeEvaluator,(ProKey *)&res_file);
  lVar10 = (pPVar6->super_QList<ProString>).d.size;
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&res_file);
  if (lVar10 != 0) {
    res_file.m_file = -0x55555556;
    res_file._36_4_ = 0xaaaaaaaa;
    res_file.m_hash = 0xaaaaaaaaaaaaaaaa;
    res_file.m_string.d.size = -0x5555555555555556;
    res_file.m_offset = -0x55555556;
    res_file.m_length = -0x55555556;
    res_file.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    res_file.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    pQVar2 = (this->super_MakefileGenerator).project;
    ProKey::ProKey((ProKey *)&defines,"RES_FILE");
    QMakeEvaluator::first(&res_file,&pQVar2->super_QMakeEvaluator,(ProKey *)&defines);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&defines);
    local_b8.size = -0x5555555555555556;
    local_b8.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_b8.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    pQVar2 = (this->super_MakefileGenerator).project;
    ProKey::ProKey((ProKey *)&local_e8,"RC_FILE");
    QMakeEvaluator::first(&defines,&pQVar2->super_QMakeEvaluator,(ProKey *)&local_e8);
    ProString::toQString((QString *)&local_1a8,&defines);
    MakefileGenerator::fileFixify
              ((QString *)&local_b8,&this->super_MakefileGenerator,(QString *)&local_1a8,
               (FileFixifyTypes)0x0,true);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_1a8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&defines);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_e8);
    pQVar2 = (this->super_MakefileGenerator).project;
    ProKey::ProKey((ProKey *)&defines,"RC_INCLUDEPATH");
    pPVar6 = QMakeEvaluator::valuesRef(&pQVar2->super_QMakeEvaluator,(ProKey *)&defines);
    local_100.d = (pPVar6->super_QList<ProString>).d.d;
    local_100.ptr = (pPVar6->super_QList<ProString>).d.ptr;
    uVar3 = (pPVar6->super_QList<ProString>).d.size;
    if (local_100.d != (Data *)0x0) {
      LOCK();
      ((local_100.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_100.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_100.size = uVar3;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&defines);
    local_118.d = (Data *)0x0;
    local_118.ptr = (char16_t *)0x0;
    local_118.size = 0;
    lVar10 = 0;
    for (uVar9 = 0; uVar9 < uVar3; uVar9 = uVar9 + 1) {
      if (*(int *)((long)&(local_100.ptr)->m_length + lVar10) != 0) {
        pQVar4 = &(local_100.ptr)->m_string;
        local_e8.m_string.d.d = (Data *)0x0;
        local_e8.m_string.d.ptr = (char16_t *)0x0;
        defines.m_string.d.d = (Data *)0x0;
        defines.m_string.d.ptr = L" /i ";
        local_e8.m_string.d.size = 0;
        defines.m_string.d.size = 4;
        QString::append((QString *)&local_118);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&defines);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_e8);
        MakefileGenerator::escapeFilePath
                  (&defines,&this->super_MakefileGenerator,
                   (ProString *)((long)&(pQVar4->d).d + lVar10));
        ::operator+=((QString *)&local_118,&defines);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&defines);
      }
      lVar10 = lVar10 + 0x30;
    }
    QMakeSourceFileInfo::addSourceFile
              ((QMakeSourceFileInfo *)this,(QString *)&local_b8,'\x01',TYPE_C);
    QList<QString>::QList<QString,void>((QList<QString> *)&defines,(QString *)&local_b8);
    QMakeSourceFileInfo::dependencies
              ((QStringList *)&local_e8,(QMakeSourceFileInfo *)this,(QString *)&local_b8);
    QList<QString>::append((QList<QString> *)&defines,(QList<QString> *)&local_e8);
    local_130.d = (Data *)defines.m_string.d.d;
    local_130.ptr = (QString *)defines.m_string.d.ptr;
    local_130.size = defines.m_string.d.size;
    if (defines.m_string.d.d != (Data *)0x0) {
      LOCK();
      ((defines.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((defines.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           1;
      UNLOCK();
    }
    QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_e8);
    QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&defines);
    defines.m_file = -0x55555556;
    defines._36_4_ = 0xaaaaaaaa;
    defines.m_hash = 0xaaaaaaaaaaaaaaaa;
    defines.m_string.d.size = -0x5555555555555556;
    defines.m_offset = -0x55555556;
    defines.m_length = -0x55555556;
    defines.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    defines.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    ProKey::ProKey((ProKey *)&local_e8,"RC_DEFINES");
    QString::QString(&local_1f0.m_string," -D");
    QString::QString((QString *)&local_148," -D");
    QString::QString((QString *)&local_160,"");
    MakefileGenerator::varGlue
              ((QString *)&local_1a8,&this->super_MakefileGenerator,(ProKey *)&local_e8,
               &local_1f0.m_string,(QString *)&local_148,(QString *)&local_160);
    ProString::ProString(&defines,(QString *)&local_1a8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_1a8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_160);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_148);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_1f0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_e8);
    if (defines.m_length == 0) {
      ProString::ProString(&local_e8," $(DEFINES)");
      ProString::operator=(&defines,&local_e8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_e8);
    }
    MakefileGenerator::escapeDependencyPath(&local_e8,&this->super_MakefileGenerator,&res_file);
    pQVar7 = operator<<(t,&local_e8);
    pQVar7 = (QTextStream *)QTextStream::operator<<(pQVar7,": ");
    MakefileGenerator::escapeDependencyPaths
              ((QStringList *)&local_160,&this->super_MakefileGenerator,(QStringList *)&local_130);
    QListSpecialMethods<QString>::join
              ((QString *)&local_148,(QListSpecialMethods<QString> *)&local_160,(QChar)0x20);
    pQVar7 = (QTextStream *)QTextStream::operator<<(pQVar7,(QString *)&local_148);
    pQVar7 = (QTextStream *)QTextStream::operator<<(pQVar7,"\n\t");
    ProKey::ProKey(&local_1a8,"QMAKE_RC");
    (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0x16])
              (&local_178,this,&local_1a8);
    pQVar7 = (QTextStream *)QTextStream::operator<<(pQVar7,(QString *)&local_178);
    pQVar2 = (this->super_MakefileGenerator).project;
    QString::QString((QString *)&local_1c0,"debug");
    bVar5 = QMakeProject::isActiveConfig(pQVar2,(QString *)&local_1c0,false);
    pcVar8 = "";
    if (bVar5) {
      pcVar8 = " -D_DEBUG";
    }
    pQVar7 = (QTextStream *)QTextStream::operator<<(pQVar7,pcVar8);
    pQVar7 = operator<<(pQVar7,&defines);
    pQVar7 = (QTextStream *)QTextStream::operator<<(pQVar7,(QString *)&local_118);
    pQVar7 = (QTextStream *)QTextStream::operator<<(pQVar7," -fo ");
    MakefileGenerator::escapeFilePath(&local_1f0,&this->super_MakefileGenerator,&res_file);
    pQVar7 = operator<<(pQVar7,&local_1f0);
    pQVar7 = (QTextStream *)QTextStream::operator<<(pQVar7,' ');
    (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0xc])
              (&local_208,this);
    QTextStream::operator<<(pQVar7,(QString *)&local_208);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_208);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_1f0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_178);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_1a8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_148);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_160);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_e8);
    pQVar7 = (QTextStream *)Qt::endl(t);
    Qt::endl(pQVar7);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&defines);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_130);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_118);
    QArrayDataPointer<ProString>::~QArrayDataPointer(&local_100);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&res_file);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Win32MakefileGenerator::writeRcFilePart(QTextStream &t)
{
    if(!project->values("RC_FILE").isEmpty()) {
        const ProString res_file = project->first("RES_FILE");
        const QString rc_file = fileFixify(project->first("RC_FILE").toQString());

        const ProStringList rcIncPaths = project->values("RC_INCLUDEPATH");
        QString incPathStr;
        for (int i = 0; i < rcIncPaths.size(); ++i) {
            const ProString &path = rcIncPaths.at(i);
            if (path.isEmpty())
                continue;
            incPathStr += QStringLiteral(" /i ");
            incPathStr += escapeFilePath(path);
        }

        addSourceFile(rc_file, QMakeSourceFileInfo::SEEK_DEPS);
        const QStringList rcDeps = QStringList(rc_file) << dependencies(rc_file);

        // The resource tool may use defines. This might be the same defines passed in as the
        // compiler, since you may use these defines in the .rc file itself.
        // As the escape syntax for the command line defines for RC is different from that for CL,
        // we might have to set specific defines for RC.
        ProString defines = varGlue("RC_DEFINES", " -D", " -D", "");
        if (defines.isEmpty())
            defines = ProString(" $(DEFINES)");

        // Also, we need to add the _DEBUG define manually since the compiler defines this symbol
        // by itself, and we use it in the automatically created rc file when VERSION is defined
        // in the .pro file.
        t << escapeDependencyPath(res_file) << ": "
          << escapeDependencyPaths(rcDeps).join(' ') << "\n\t"
          << var("QMAKE_RC") << (project->isActiveConfig("debug") ? " -D_DEBUG" : "")
          << defines << incPathStr << " -fo " << escapeFilePath(res_file)
          << ' ' << escapeFilePath(rc_file);
        t << Qt::endl << Qt::endl;
    }
}